

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expressions.cpp
# Opt level: O1

void __thiscall
CCallMethodExp::CCallMethodExp
          (CCallMethodExp *this,IExpression *_objectExpression,CIdExp *_methodName,CExpList *_args)

{
  CIdExp *pCVar1;
  CExpList *pCVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  (this->super_IExpression).super_PositionedNode.super_INode._vptr_INode =
       (_func_int **)&PTR_Accept_001822e8;
  (this->objectExpression)._M_t.
  super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
  super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
  super__Head_base<0UL,_IExpression_*,_false>._M_head_impl = (IExpression *)0x0;
  (this->methodName)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
  super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
  super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl = (CIdExp *)0x0;
  (this->args)._M_t.super___uniq_ptr_impl<CExpList,_std::default_delete<CExpList>_>._M_t.
  super__Tuple_impl<0UL,_CExpList_*,_std::default_delete<CExpList>_>.
  super__Head_base<0UL,_CExpList_*,_false>._M_head_impl = (CExpList *)0x0;
  iVar3 = (_methodName->super_IExpression).super_PositionedNode.position.lastLine;
  iVar4 = (_methodName->super_IExpression).super_PositionedNode.position.firstColumn;
  iVar5 = (_methodName->super_IExpression).super_PositionedNode.position.lastColumn;
  (this->super_IExpression).super_PositionedNode.position.firstLine =
       (_methodName->super_IExpression).super_PositionedNode.position.firstLine;
  (this->super_IExpression).super_PositionedNode.position.lastLine = iVar3;
  (this->super_IExpression).super_PositionedNode.position.firstColumn = iVar4;
  (this->super_IExpression).super_PositionedNode.position.lastColumn = iVar5;
  (this->objectExpression)._M_t.
  super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
  super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
  super__Head_base<0UL,_IExpression_*,_false>._M_head_impl = _objectExpression;
  pCVar1 = (this->methodName)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
           super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
           super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl;
  (this->methodName)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
  super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
  super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl = _methodName;
  if (pCVar1 != (CIdExp *)0x0) {
    (**(code **)(*(long *)&(pCVar1->super_IExpression).super_PositionedNode + 0x10))();
  }
  pCVar2 = (this->args)._M_t.super___uniq_ptr_impl<CExpList,_std::default_delete<CExpList>_>._M_t.
           super__Tuple_impl<0UL,_CExpList_*,_std::default_delete<CExpList>_>.
           super__Head_base<0UL,_CExpList_*,_false>._M_head_impl;
  (this->args)._M_t.super___uniq_ptr_impl<CExpList,_std::default_delete<CExpList>_>._M_t.
  super__Tuple_impl<0UL,_CExpList_*,_std::default_delete<CExpList>_>.
  super__Head_base<0UL,_CExpList_*,_false>._M_head_impl = _args;
  if (pCVar2 != (CExpList *)0x0) {
    (**(code **)(*(long *)&(pCVar2->super_IExpression).super_PositionedNode + 0x10))();
    return;
  }
  return;
}

Assistant:

CCallMethodExp::CCallMethodExp( IExpression* _objectExpression, CIdExp *_methodName, CExpList *_args ) {
    this->position = _methodName->position;
    objectExpression = std::unique_ptr<IExpression>(_objectExpression);
    methodName = std::unique_ptr<CIdExp>( _methodName );
    args = std::unique_ptr<CExpList>( _args );
}